

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  int iVar2;
  Gpio gpio_2;
  Gpio gpio_1;
  Gpio local_18;
  Gpio local_10;
  
  signal(2,sig_handler);
  mraa::Gpio::Gpio(&local_10,0x17,true,false);
  mraa::Gpio::Gpio(&local_18,0x18,true,false);
  iVar1 = mraa_gpio_dir(local_10.m_gpio,0);
  if (iVar1 == 0) {
    iVar1 = mraa_gpio_dir(local_18.m_gpio,0);
    if (iVar1 == 0) {
      iVar2 = 0;
      while (flag != 0) {
        iVar1 = mraa_gpio_write(local_10.m_gpio,1);
        if (iVar1 != 0) goto LAB_0010236f;
        iVar1 = mraa_gpio_write(local_18.m_gpio,0);
        if (iVar1 != 0) goto LAB_0010236f;
        sleep(1);
        iVar1 = mraa_gpio_write(local_10.m_gpio,0);
        if (iVar1 != 0) goto LAB_0010236f;
        iVar1 = mraa_gpio_write(local_18.m_gpio,1);
        if (iVar1 != 0) goto LAB_0010236f;
        sleep(1);
      }
      goto LAB_0010237b;
    }
  }
LAB_0010236f:
  iVar2 = 1;
  mraa_result_print(iVar1);
LAB_0010237b:
  mraa::Gpio::~Gpio(&local_18);
  mraa::Gpio::~Gpio(&local_10);
  return iVar2;
}

Assistant:

int
main(void)
{
    mraa::Result status;

    /* install signal handler */
    signal(SIGINT, sig_handler);

    //! [Interesting]
    /* initialize GPIO pin */
    mraa::Gpio gpio_1(GPIO_PIN_1);

    /* initialize GPIO pin */
    mraa::Gpio gpio_2(GPIO_PIN_2);

    /* set GPIO to output */
    status = gpio_1.dir(mraa::DIR_OUT);
    if (status != mraa::SUCCESS) {
        printError(status);
        return EXIT_FAILURE;
    }

    /* set gpio 24 to output */
    status = gpio_2.dir(mraa::DIR_OUT);
    if (status != mraa::SUCCESS) {
        printError(status);
        return EXIT_FAILURE;
    }

    /* toggle both GPIO's */
    while (flag) {
        status = gpio_1.write(1);
        if (status != mraa::SUCCESS) {
            printError(status);
            return EXIT_FAILURE;
        }
        status = gpio_2.write(0);
        if (status != mraa::SUCCESS) {
            printError(status);
            return EXIT_FAILURE;
        }

        sleep(1);

        status = gpio_1.write(0);
        if (status != mraa::SUCCESS) {
            printError(status);
            return EXIT_FAILURE;
        }

        status = gpio_2.write(1);
        if (status != mraa::SUCCESS) {
            printError(status);
            return EXIT_FAILURE;
        }

        sleep(1);
    }
    //! [Interesting]

    return EXIT_SUCCESS;
}